

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartType.cpp
# Opt level: O2

bool Imf_3_4::isTiled(string *name)

{
  __type _Var1;
  
  _Var1 = std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               TILEDIMAGE_abi_cxx11_);
  if (_Var1) {
    return true;
  }
  _Var1 = std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               DEEPTILE_abi_cxx11_);
  return _Var1;
}

Assistant:

bool
isTiled (const string& name)
{
    return (name == TILEDIMAGE || name == DEEPTILE);
}